

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

int Extra_bddCheckVarsSymmetricNaive(DdManager *dd,DdNode *bF,int iVar1,int iVar2)

{
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  DdNode *n_02;
  int Res;
  DdNode *bCof10;
  DdNode *bCof01;
  DdNode *bCube2;
  DdNode *bCube1;
  int iVar2_local;
  int iVar1_local;
  DdNode *bF_local;
  DdManager *dd_local;
  
  if (iVar1 == iVar2) {
    __assert_fail("iVar1 != iVar2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddSymm.c"
                  ,0x1c5,"int Extra_bddCheckVarsSymmetricNaive(DdManager *, DdNode *, int, int)");
  }
  if (iVar1 < dd->size) {
    if (iVar2 < dd->size) {
      n = Cudd_bddAnd(dd,(DdNode *)((ulong)dd->vars[iVar1] ^ 1),dd->vars[iVar2]);
      Cudd_Ref(n);
      n_00 = Cudd_bddAnd(dd,(DdNode *)((ulong)dd->vars[iVar2] ^ 1),dd->vars[iVar1]);
      Cudd_Ref(n_00);
      n_01 = Cudd_Cofactor(dd,bF,n);
      Cudd_Ref(n_01);
      n_02 = Cudd_Cofactor(dd,bF,n_00);
      Cudd_Ref(n_02);
      Cudd_RecursiveDeref(dd,n_01);
      Cudd_RecursiveDeref(dd,n_02);
      Cudd_RecursiveDeref(dd,n);
      Cudd_RecursiveDeref(dd,n_00);
      return (uint)(n_02 == n_01);
    }
    __assert_fail("iVar2 < dd->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddSymm.c"
                  ,0x1c7,"int Extra_bddCheckVarsSymmetricNaive(DdManager *, DdNode *, int, int)");
  }
  __assert_fail("iVar1 < dd->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddSymm.c"
                ,0x1c6,"int Extra_bddCheckVarsSymmetricNaive(DdManager *, DdNode *, int, int)");
}

Assistant:

int Extra_bddCheckVarsSymmetricNaive( 
  DdManager * dd,   /* the DD manager */
  DdNode * bF,
  int iVar1,
  int iVar2) 
{
    DdNode * bCube1, * bCube2;
    DdNode * bCof01, * bCof10;
    int Res;

    assert( iVar1 != iVar2 );
    assert( iVar1 < dd->size );
    assert( iVar2 < dd->size );

    bCube1 = Cudd_bddAnd( dd, Cudd_Not( dd->vars[iVar1] ), dd->vars[iVar2] );   Cudd_Ref( bCube1 );
    bCube2 = Cudd_bddAnd( dd, Cudd_Not( dd->vars[iVar2] ), dd->vars[iVar1] );   Cudd_Ref( bCube2 );

    bCof01 = Cudd_Cofactor( dd, bF, bCube1 );  Cudd_Ref( bCof01 );
    bCof10 = Cudd_Cofactor( dd, bF, bCube2 );  Cudd_Ref( bCof10 );

    Res = (int)( bCof10 == bCof01 );

    Cudd_RecursiveDeref( dd, bCof01 );
    Cudd_RecursiveDeref( dd, bCof10 );
    Cudd_RecursiveDeref( dd, bCube1 );
    Cudd_RecursiveDeref( dd, bCube2 );

    return Res;
}